

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::RobustnessTestCase
          (RobustnessTestCase *this,EglTestContext *eglTestCtx,char *name,char *description,
          Params *params)

{
  TestCase::TestCase(&this->super_TestCase,eglTestCtx,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_003d8d88;
  Params::Params(&this->m_params,params);
  this->m_eglSurface = (EGLSurface)0x0;
  this->m_window = (NativeWindow *)0x0;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglConfig = (EGLConfig)0x0;
  (this->m_glContextType).super_ApiType.m_bits = 0x300;
  return;
}

Assistant:

RobustnessTestCase::RobustnessTestCase (EglTestContext& eglTestCtx, const char* name, const char* description, Params params)
	: TestCase			(eglTestCtx, name, description)
	, m_params			(params)
	, m_eglDisplay		(EGL_NO_DISPLAY)
	, m_eglConfig		(0)
	, m_eglSurface		(EGL_NO_SURFACE)
	, m_window			(DE_NULL)
{
}